

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_char_resize(ImVector_char *self,int new_size)

{
  int new_size_local;
  ImVector_char *self_local;
  
  ImVector<char>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_char_resize(ImVector_char* self,int new_size)
{
    return self->resize(new_size);
}